

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

int If_ManImproveNodeFaninCompact2
              (If_Man_t *p,If_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  int iVar1;
  If_Obj_t *pObj_00;
  int local_44;
  int i;
  If_Obj_t *pFanin;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFront_local;
  int nLimit_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vFront);
    if (iVar1 <= local_44) {
      return 0;
    }
    pObj_00 = (If_Obj_t *)Vec_PtrEntry(vFront,local_44);
    iVar1 = If_ObjIsCi(pObj_00);
    if ((iVar1 == 0) && (iVar1 = If_ManImproveNodeFaninCost(p,pObj_00), iVar1 < 1)) break;
    local_44 = local_44 + 1;
  }
  If_ManImproveNodeFaninUpdate(p,pObj_00,vFront,vVisited);
  return 1;
}

Assistant:

int If_ManImproveNodeFaninCompact2( If_Man_t * p, If_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    int i;
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
    {
        if ( If_ObjIsCi(pFanin) )
            continue;
        if ( If_ManImproveNodeFaninCost(p, pFanin) <= 0 )
        {
            If_ManImproveNodeFaninUpdate( p, pFanin, vFront, vVisited );
            return 1;
        }
    }
    return 0;
}